

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<bool,_64UL>::resize(SmallVector<bool,_64UL> *this,size_t new_size)

{
  ulong uVar1;
  
  if ((this->super_VectorView<bool>).buffer_size < new_size) {
    reserve(this,new_size);
    uVar1 = (this->super_VectorView<bool>).buffer_size;
    if (uVar1 <= new_size && new_size - uVar1 != 0) {
      memset((this->super_VectorView<bool>).ptr + uVar1,0,new_size - uVar1);
    }
  }
  (this->super_VectorView<bool>).buffer_size = new_size;
  return;
}

Assistant:

void resize(size_t new_size) SPIRV_CROSS_NOEXCEPT
	{
		if (new_size < this->buffer_size)
		{
			for (size_t i = new_size; i < this->buffer_size; i++)
				this->ptr[i].~T();
		}
		else if (new_size > this->buffer_size)
		{
			reserve(new_size);
			for (size_t i = this->buffer_size; i < new_size; i++)
				new (&this->ptr[i]) T();
		}

		this->buffer_size = new_size;
	}